

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::anon_unknown_6::LineBufferTask::execute(LineBufferTask_conflict2 *this)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_type sVar4;
  reference ppOVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  size_t __n;
  int *piVar9;
  Compression *maxScanLineSize;
  Compressor *pCVar10;
  int iVar11;
  long in_RDI;
  long lVar12;
  exception *e;
  Int64 compSize;
  char *compPtr;
  Compressor *compressor;
  int j_1;
  int count;
  int i_4;
  Int64 tableDataSize;
  char *ptr;
  int i_3;
  int pos;
  int i_2;
  Int64 maxBytesPerLine;
  Int64 totalBytes;
  OutSliceInfo_conflict *slice;
  uint i_1;
  char *writePtr;
  int y;
  int j;
  int i;
  int dy;
  int yStop;
  int yStart;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  ptrdiff_t in_stack_fffffffffffffdd8;
  ptrdiff_t in_stack_fffffffffffffde0;
  char *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  Header *in_stack_fffffffffffffe08;
  char *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  long *plVar13;
  Compression c;
  Header *in_stack_fffffffffffffe20;
  PixelType in_stack_fffffffffffffe28;
  Format in_stack_fffffffffffffe2c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe98;
  ptrdiff_t in_stack_fffffffffffffea0;
  ptrdiff_t in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  char **in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffed8;
  uint *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  uint *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  undefined8 local_b8;
  long *local_b0;
  int local_a4;
  int local_a0;
  int local_9c;
  ulong local_98;
  char *local_90;
  int local_84;
  int local_80;
  int local_7c;
  ulong local_78;
  long local_70;
  value_type local_68;
  uint local_5c;
  char *local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_34;
  int local_30;
  int local_2c;
  
  if (*(int *)(*(long *)(in_RDI + 0x10) + 0xb8) == 0) {
    local_2c = *(int *)(*(long *)(in_RDI + 0x18) + 0x68);
    local_30 = *(int *)(*(long *)(in_RDI + 0x18) + 0x6c) + 1;
    local_34 = 1;
  }
  else {
    local_2c = *(int *)(*(long *)(in_RDI + 0x18) + 0x6c);
    local_30 = *(int *)(*(long *)(in_RDI + 0x18) + 0x68) + -1;
    local_34 = -1;
  }
  lVar12 = *(long *)(in_RDI + 0x10) + 0xe8;
  bytesPerDeepLineTable
            (in_stack_fffffffffffffe20,(int)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             (int)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),(int)in_stack_fffffffffffffe08,
             in_stack_fffffffffffffe30);
  for (local_48 = *(int *)(*(long *)(in_RDI + 0x18) + 0x68);
      local_48 <= *(int *)(*(long *)(in_RDI + 0x18) + 0x6c); local_48 = local_48 + 1) {
    in_stack_ffffffffffffff20 = Array::operator_cast_to_Array_(*(Array **)(in_RDI + 0x18));
    in_stack_ffffffffffffff20 =
         in_stack_ffffffffffffff20 +
         (long)(local_48 - *(int *)(*(long *)(in_RDI + 0x18) + 0x60)) * 0x10;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               (*(long *)(in_RDI + 0x10) + 0xe8),
               (long)(local_48 - *(int *)(*(long *)(in_RDI + 0x10) + 0xc4)));
    Array<char>::resizeErase
              ((Array<char> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    for (local_4c = *(int *)(*(long *)(in_RDI + 0x10) + 0xbc);
        local_4c <= *(int *)(*(long *)(in_RDI + 0x10) + 0xc0); local_4c = local_4c + 1) {
      in_stack_ffffffffffffff18 =
           DeepScanLineOutputFile::Data::getSampleCount
                     ((Data *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                      (int)((ulong)lVar12 >> 0x20),(int)lVar12);
      in_stack_ffffffffffffff0c = *in_stack_ffffffffffffff18;
      in_stack_ffffffffffffff10 =
           Array::operator_cast_to_unsigned_int_((Array *)(*(long *)(in_RDI + 0x10) + 0x158));
      iVar11 = local_48 - *(int *)(*(long *)(in_RDI + 0x10) + 0xc4);
      in_stack_ffffffffffffff10[iVar11] =
           in_stack_ffffffffffffff0c + in_stack_ffffffffffffff10[iVar11];
    }
  }
  for (local_50 = local_2c; local_50 != local_30; local_50 = local_34 + local_50) {
    pcVar2 = Array::operator_cast_to_Array_(*(Array **)(in_RDI + 0x18));
    pcVar3 = Array::operator_cast_to_char_
                       ((Array *)(pcVar2 + (long)(local_50 -
                                                 *(int *)(*(long *)(in_RDI + 0x18) + 0x60)) * 0x10))
    ;
    local_5c = 0;
    local_58 = pcVar3;
    while( true ) {
      uVar7 = (ulong)local_5c;
      sVar4 = std::
              vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
              ::size((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                      *)(*(long *)(in_RDI + 0x10) + 0x108));
      if (sVar4 <= uVar7) break;
      ppOVar5 = std::
                vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                ::operator[]((vector<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
                              *)(*(long *)(in_RDI + 0x10) + 0x108),(ulong)local_5c);
      iVar1 = (int)uVar7;
      local_68 = *ppOVar5;
      iVar11 = Imath_2_5::modp(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0);
      if (iVar11 == 0) {
        if ((local_68->zero & 1U) == 0) {
          lVar6 = *(long *)(in_RDI + 0x10);
          in_stack_fffffffffffffdb0 = *(int *)(lVar6 + 0xc0);
          in_stack_fffffffffffffdd8 = local_68->sampleStride;
          in_stack_fffffffffffffde0 = local_68->xStride;
          in_stack_fffffffffffffde8 = (char *)local_68->yStride;
          in_stack_fffffffffffffdf0 = *(undefined4 *)(lVar6 + 0x100);
          lVar12 = CONCAT44((int)((ulong)lVar12 >> 0x20),*(undefined4 *)(lVar6 + 0xbc));
          in_stack_fffffffffffffdc0 = 0;
          in_stack_fffffffffffffdb8 = 0;
          copyFromDeepFrameBuffer
                    (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                     in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                     (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),(int)&stack0xfffffffffffffda8,
                     in_stack_fffffffffffffed8,(int)in_stack_fffffffffffffee0,
                     in_stack_fffffffffffffee8,iVar1,(int)pcVar3,(ptrdiff_t)pcVar2,
                     CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                     (ptrdiff_t)in_stack_ffffffffffffff10,(Format)in_stack_ffffffffffffff18,
                     (PixelType)in_stack_ffffffffffffff20);
        }
        else {
          in_stack_fffffffffffffed8 = *(int *)(*(long *)(in_RDI + 0x10) + 0x100);
          in_stack_fffffffffffffee0 =
               Array::operator_cast_to_unsigned_int_((Array *)(*(long *)(in_RDI + 0x10) + 0x158));
          fillChannelWithZeroes
                    ((char **)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                     in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
        }
      }
      local_5c = local_5c + 1;
    }
  }
  if ((local_50 < *(int *)(*(long *)(in_RDI + 0x18) + 0x60)) ||
     (*(int *)(*(long *)(in_RDI + 0x18) + 100) < local_50)) {
    local_70 = 0;
    local_78 = 0;
    for (local_7c = 0;
        local_7c <
        (*(int *)(*(long *)(in_RDI + 0x18) + 100) - *(int *)(*(long *)(in_RDI + 0x18) + 0x60)) + 1;
        local_7c = local_7c + 1) {
      pcVar2 = Array::operator_cast_to_Array_(*(Array **)(in_RDI + 0x18));
      lVar6 = Array<char>::size((Array<char> *)(pcVar2 + (long)local_7c * 0x10));
      local_70 = local_70 + lVar6;
      pcVar2 = Array::operator_cast_to_Array_(*(Array **)(in_RDI + 0x18));
      uVar7 = Array<char>::size((Array<char> *)(pcVar2 + (long)local_7c * 0x10));
      if (local_78 < uVar7) {
        pcVar2 = Array::operator_cast_to_Array_(*(Array **)(in_RDI + 0x18));
        local_78 = Array<char>::size((Array<char> *)(pcVar2 + (long)local_7c * 0x10));
      }
    }
    Array<char>::resizeErase
              ((Array<char> *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
               CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
    local_80 = 0;
    for (local_84 = 0;
        local_84 <
        (*(int *)(*(long *)(in_RDI + 0x18) + 100) - *(int *)(*(long *)(in_RDI + 0x18) + 0x60)) + 1;
        local_84 = local_84 + 1) {
      pcVar2 = Array::operator_cast_to_char_((Array *)(*(long *)(in_RDI + 0x18) + 0x10));
      lVar6 = (long)local_80;
      pcVar3 = Array::operator_cast_to_Array_(*(Array **)(in_RDI + 0x18));
      pcVar3 = Array::operator_cast_to_char_((Array *)(pcVar3 + (long)local_84 * 0x10));
      pcVar8 = Array::operator_cast_to_Array_(*(Array **)(in_RDI + 0x18));
      __n = Array<char>::size((Array<char> *)(pcVar8 + (long)local_84 * 0x10));
      memcpy(pcVar2 + lVar6,pcVar3,__n);
      pcVar2 = Array::operator_cast_to_Array_(*(Array **)(in_RDI + 0x18));
      lVar6 = Array<char>::size((Array<char> *)(pcVar2 + (long)local_84 * 0x10));
      local_80 = local_80 + (int)lVar6;
    }
    pcVar2 = Array::operator_cast_to_char_((Array *)(*(long *)(in_RDI + 0x18) + 0x10));
    *(char **)(*(long *)(in_RDI + 0x18) + 0x20) = pcVar2;
    *(long *)(*(long *)(in_RDI + 0x18) + 0x30) = local_70;
    *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x28) =
         *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x30);
    local_90 = Array::operator_cast_to_char_((Array *)(*(long *)(in_RDI + 0x18) + 0x38));
    local_98 = 0;
    local_9c = *(int *)(*(long *)(in_RDI + 0x18) + 0x60);
    while( true ) {
      iVar11 = (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
      c = (Compression)((ulong)in_stack_fffffffffffffe18 >> 0x20);
      if (*(int *)(*(long *)(in_RDI + 0x18) + 100) < local_9c) break;
      local_a0 = 0;
      for (local_a4 = *(int *)(*(long *)(in_RDI + 0x10) + 0xbc);
          local_a4 <= *(int *)(*(long *)(in_RDI + 0x10) + 0xc0); local_a4 = local_a4 + 1) {
        piVar9 = DeepScanLineOutputFile::Data::getSampleCount
                           ((Data *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                            (int)((ulong)lVar12 >> 0x20),(int)lVar12);
        local_a0 = local_a0 + *piVar9;
        Xdr::write<Imf_2_5::CharPtrIO,char*>
                  ((char **)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (int)((ulong)lVar12 >> 0x20));
        local_98 = local_98 + 4;
      }
      local_9c = local_9c + 1;
    }
    if (*(long *)(*(long *)(in_RDI + 0x18) + 0x58) != 0) {
      plVar13 = *(long **)(*(long *)(in_RDI + 0x18) + 0x58);
      pcVar2 = Array::operator_cast_to_char_((Array *)(*(long *)(in_RDI + 0x18) + 0x38));
      iVar1 = (**(code **)(*plVar13 + 0x20))
                        (plVar13,pcVar2,local_98 & 0xffffffff,
                         *(undefined4 *)(*(long *)(in_RDI + 0x18) + 0x60),
                         *(long *)(in_RDI + 0x18) + 0x48);
      *(long *)(*(long *)(in_RDI + 0x18) + 0x50) = (long)iVar1;
    }
    if ((*(long *)(*(long *)(in_RDI + 0x18) + 0x58) == 0) ||
       (local_98 <= *(ulong *)(*(long *)(in_RDI + 0x18) + 0x50))) {
      *(ulong *)(*(long *)(in_RDI + 0x18) + 0x50) = local_98;
      pcVar2 = Array::operator_cast_to_char_((Array *)(*(long *)(in_RDI + 0x18) + 0x38));
      *(char **)(*(long *)(in_RDI + 0x18) + 0x48) = pcVar2;
    }
    if (*(long *)(*(long *)(in_RDI + 0x18) + 0x70) != 0) {
      plVar13 = *(long **)(*(long *)(in_RDI + 0x18) + 0x70);
      if (plVar13 != (long *)0x0) {
        (**(code **)(*plVar13 + 8))();
      }
      c = (Compression)((ulong)plVar13 >> 0x20);
    }
    maxScanLineSize = Header::compression((Header *)0x2e4b53);
    pCVar10 = newCompressor(c,(size_t)maxScanLineSize,in_stack_fffffffffffffe08);
    *(Compressor **)(*(long *)(in_RDI + 0x18) + 0x70) = pCVar10;
    local_b0 = *(long **)(*(long *)(in_RDI + 0x18) + 0x70);
    if (local_b0 != (long *)0x0) {
      lVar12 = *(long *)(in_RDI + 0x18);
      iVar1 = (**(code **)(*local_b0 + 0x20))
                        (local_b0,*(undefined8 *)(lVar12 + 0x20),*(undefined4 *)(lVar12 + 0x30),
                         *(undefined4 *)(lVar12 + 0x60),&local_b8);
      if ((ulong)(long)iVar1 < *(ulong *)(*(long *)(in_RDI + 0x18) + 0x30)) {
        *(long *)(*(long *)(in_RDI + 0x18) + 0x30) = (long)iVar1;
        *(undefined8 *)(*(long *)(in_RDI + 0x18) + 0x20) = local_b8;
      }
      else if (*(int *)(*(long *)(in_RDI + 0x10) + 0x100) == 0) {
        convertToXdr((Data *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                     in_stack_fffffffffffffde8,(int)((ulong)in_stack_fffffffffffffde0 >> 0x20),
                     (int)in_stack_fffffffffffffde0,iVar11);
      }
    }
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + 0x78) = 0;
  }
  return;
}

Assistant:

void
LineBufferTask::execute ()
{
    try
    {
        //
        // First copy the pixel data from the
	// frame buffer into the line buffer
        //
        
        int yStart, yStop, dy;

        if (_ofd->lineOrder == INCREASING_Y)
        {
            yStart = _lineBuffer->scanLineMin;
            yStop = _lineBuffer->scanLineMax + 1;
            dy = 1;
        }
        else
        {
            yStart = _lineBuffer->scanLineMax;
            yStop = _lineBuffer->scanLineMin - 1;
            dy = -1;
        }
    
	int y;

        for (y = yStart; y != yStop; y += dy)
        {
            //
            // Gather one scan line's worth of pixel data and store
            // them in _ofd->lineBuffer.
            //
        
            char *writePtr = _lineBuffer->buffer +
                             _ofd->offsetInLineBuffer[y - _ofd->minY];
            //
            // Iterate over all image channels.
            //

            for (unsigned int i = 0; i < _ofd->slices.size(); ++i)
            {
                //
                // Test if scan line y of this channel contains any data
		// (the scan line contains data only if y % ySampling == 0).
                //
        
                const OutSliceInfo &slice = _ofd->slices[i];
        
                if (modp (y, slice.ySampling) != 0)
                    continue;
        
                //
                // Find the x coordinates of the leftmost and rightmost
                // sampled pixels (i.e. pixels within the data window
                // for which x % xSampling == 0).
                //
        
                int dMinX = divp (_ofd->minX, slice.xSampling);
                int dMaxX = divp (_ofd->maxX, slice.xSampling);
        
                //
		// Fill the line buffer with with pixel data.
                //
        
                if (slice.zero)
                {
                    //
                    // The frame buffer contains no data for this channel.
                    // Store zeroes in _lineBuffer->buffer.
                    //
                    
                    fillChannelWithZeroes (writePtr, _ofd->format, slice.type,
                                           dMaxX - dMinX + 1);
                }
                else
                {
                    //
                    // If necessary, convert the pixel data to Xdr format.
		    // Then store the pixel data in _ofd->lineBuffer.
                    //
        
                    const char *linePtr = slice.base +
                                          divp (y, slice.ySampling) *
                                          slice.yStride;
        
                    const char *readPtr = linePtr + dMinX * slice.xStride;
                    const char *endPtr  = linePtr + dMaxX * slice.xStride;
    
                    copyFromFrameBuffer (writePtr, readPtr, endPtr,
                                         slice.xStride, _ofd->format,
                                         slice.type);
                }
            }
        
            if (_lineBuffer->endOfLineBufferData < writePtr)
                _lineBuffer->endOfLineBufferData = writePtr;
        
            #ifdef DEBUG
        
                assert (writePtr - (_lineBuffer->buffer +
                        _ofd->offsetInLineBuffer[y - _ofd->minY]) ==
                        (int) _ofd->bytesPerLine[y - _ofd->minY]);
        
            #endif
        
        }
    
        //
        // If the next scanline isn't past the bounds of the lineBuffer
        // then we are done, otherwise compress the linebuffer
        //
    
        if (y >= _lineBuffer->minY && y <= _lineBuffer->maxY)
            return;
    
        _lineBuffer->dataPtr = _lineBuffer->buffer;

        _lineBuffer->dataSize = _lineBuffer->endOfLineBufferData -
                                _lineBuffer->buffer;
    
	//
        // Compress the data
	//

        Compressor *compressor = _lineBuffer->compressor;

        if (compressor)
        {
            const char *compPtr;

            int compSize = compressor->compress (_lineBuffer->dataPtr,
                                                 _lineBuffer->dataSize,
                                                 _lineBuffer->minY, compPtr);
    
            if (compSize < _lineBuffer->dataSize)
            {
                _lineBuffer->dataSize = compSize;
                _lineBuffer->dataPtr = compPtr;
            }
            else if (_ofd->format == Compressor::NATIVE)
            {
                //
                // The data did not shrink during compression, but
                // we cannot write to the file using the machine's
                // native format, so we need to convert the lineBuffer
                // to Xdr.
                //
    
                convertToXdr (_ofd, _lineBuffer->buffer, _lineBuffer->minY,
                              _lineBuffer->maxY, _lineBuffer->dataSize);
            }
        }

        _lineBuffer->partiallyFull = false;
    }
    catch (std::exception &e)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = e.what ();
            _lineBuffer->hasException = true;
        }
    }
    catch (...)
    {
        if (!_lineBuffer->hasException)
        {
            _lineBuffer->exception = "unrecognized exception";
            _lineBuffer->hasException = true;
        }
    }
}